

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::ExportSwiftObjectCompileCommand
          (cmNinjaTargetGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *moduleSourceFiles,
          string *moduleObjectFilename,string *flags,string *defines,string *includes,
          string *outputConfig,bool singleOutput)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmSourceFile *source;
  bool bVar1;
  string *psVar2;
  size_type __n;
  cmLocalNinjaGenerator *pcVar3;
  reference ppcVar4;
  pointer this_02;
  container_type *cmdLines;
  cmGlobalNinjaGenerator *this_03;
  string local_3e0;
  undefined1 local_3c0 [8];
  string commandLine;
  string *cmd;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  undefined1 local_360 [8];
  string objectFilename;
  string sourceFilename;
  cmSourceFile *sf_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1_1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  cmList compileCmds;
  string local_2d8;
  string *local_2b8;
  string *compileCommand;
  string_view local_2a0;
  undefined1 local_290 [8];
  string escapedSourceFilenames;
  string local_250;
  cmSourceFile *local_230;
  cmSourceFile *sf;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  RuleVariables compileObjectVars;
  string escapedModuleObjectFilename;
  anon_class_8_1_8991fb9c escapeSourceFileName;
  allocator<char> local_61;
  string local_60;
  byte local_39;
  string *psStack_38;
  bool singleOutput_local;
  string *includes_local;
  string *defines_local;
  string *flags_local;
  string *moduleObjectFilename_local;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *moduleSourceFiles_local;
  cmNinjaTargetGenerator *this_local;
  
  local_39 = singleOutput;
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  psStack_38 = includes;
  includes_local = defines;
  defines_local = flags;
  flags_local = moduleObjectFilename;
  moduleObjectFilename_local = (string *)moduleSourceFiles;
  moduleSourceFiles_local =
       (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"EXPORT_COMPILE_COMMANDS",&local_61);
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    escapedModuleObjectFilename.field_2._8_8_ = this;
    psVar2 = ConvertToNinjaPath(this,flags_local);
    std::__cxx11::string::string((string *)&compileObjectVars.Launcher,(string *)psVar2);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)
               &filenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    compileObjectVars.TargetVersionMinor = "Swift";
    compileObjectVars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
    compileObjectVars.LanguageCompileFlags = (char *)std::__cxx11::string::c_str();
    compileObjectVars.Defines = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
    __n = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::size
                    ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                     moduleObjectFilename_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1,__n);
    psVar2 = moduleObjectFilename_local;
    __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        moduleObjectFilename_local);
    sf = (cmSourceFile *)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)psVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                       *)&sf), bVar1) {
      ppcVar4 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&__end1);
      local_230 = *ppcVar4;
      GetCompiledSourceNinjaPath_abi_cxx11_
                ((string *)((long)&escapedSourceFilenames.field_2 + 8),this,local_230);
      ExportSwiftObjectCompileCommand(std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool)
      ::$_0::operator()::string__const
                (&local_250,(void *)((long)&escapedModuleObjectFilename.field_2 + 8),
                 (string *)((long)&escapedSourceFilenames.field_2 + 8));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range1,
                 &local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)(escapedSourceFilenames.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end1);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a0," ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&compileCommand);
    cmJoin((string *)local_290,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1,local_2a0,_compileCommand);
    compileObjectVars.LinkLibraries = (char *)std::__cxx11::string::c_str();
    this_01 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"CMAKE_Swift_COMPILE_OBJECT",
               (allocator<char> *)
               ((long)&compileCmds.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    psVar2 = cmMakefile::GetRequiredDefinition(this_01,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&compileCmds.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_2b8 = psVar2;
    cmList::cmList((cmList *)&rulePlaceholderExpander,psVar2,Yes,No);
    pcVar3 = GetLocalGenerator(this);
    (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[6])(&__range1_1);
    psVar2 = moduleObjectFilename_local;
    __end1_1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                         ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                          moduleObjectFilename_local);
    sf_1 = (cmSourceFile *)
           std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)psVar2)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                               *)&sf_1), bVar1) {
      ppcVar4 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&__end1_1);
      source = *ppcVar4;
      GetCompiledSourceNinjaPath_abi_cxx11_
                ((string *)((long)&objectFilename.field_2 + 8),this,source);
      std::__cxx11::string::string((string *)local_360,(string *)&compileObjectVars.Launcher);
      if ((local_39 & 1) == 0) {
        GetObjectFilePath((string *)&__range2,this,source,outputConfig);
        psVar2 = ConvertToNinjaPath(this,(string *)&__range2);
        std::__cxx11::string::operator=((string *)local_360,(string *)psVar2);
        std::__cxx11::string::~string((string *)&__range2);
      }
      compileObjectVars.AIXExports = (char *)std::__cxx11::string::c_str();
      __end2 = cmList::begin_abi_cxx11_((cmList *)&rulePlaceholderExpander);
      cmd = (string *)cmList::end_abi_cxx11_((cmList *)&rulePlaceholderExpander);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&cmd), bVar1) {
        commandLine.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
        this_02 = std::
                  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                  ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                                *)&__range1_1);
        pcVar3 = GetLocalGenerator(this);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (this_02,(cmOutputConverter *)pcVar3,(string *)commandLine.field_2._8_8_,
                   (RuleVariables *)
                   &filenames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      pcVar3 = GetLocalGenerator(this);
      cmdLines = cmList::operator_cast_to_vector_((cmList *)&rulePlaceholderExpander);
      std::__cxx11::string::string((string *)&local_3e0);
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)local_3c0,pcVar3,cmdLines,outputConfig,outputConfig,&local_3e0,
                 (cmGeneratorTarget *)0x0);
      std::__cxx11::string::~string((string *)&local_3e0);
      this_03 = GetGlobalGenerator(this);
      cmGlobalNinjaGenerator::AddCXXCompileCommand
                (this_03,(string *)local_3c0,(string *)((long)&objectFilename.field_2 + 8),
                 (string *)local_360);
      std::__cxx11::string::~string((string *)local_3c0);
      std::__cxx11::string::~string((string *)local_360);
      std::__cxx11::string::~string((string *)(objectFilename.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end1_1);
    }
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&__range1_1);
    cmList::~cmList((cmList *)&rulePlaceholderExpander);
    std::__cxx11::string::~string((string *)local_290);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
    std::__cxx11::string::~string((string *)&compileObjectVars.Launcher);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportSwiftObjectCompileCommand(
  std::vector<cmSourceFile const*> const& moduleSourceFiles,
  std::string const& moduleObjectFilename, std::string const& flags,
  std::string const& defines, std::string const& includes,
  std::string const& outputConfig, bool singleOutput)
{
  if (!this->GeneratorTarget->GetPropertyAsBool("EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  auto escapeSourceFileName = [this](std::string srcFilename) -> std::string {
    if (!cmSystemTools::FileIsFullPath(srcFilename)) {
      srcFilename =
        cmSystemTools::CollapseFullPath(srcFilename,
                                        this->GetGlobalGenerator()
                                          ->GetCMakeInstance()
                                          ->GetHomeOutputDirectory());
    }

    return this->LocalGenerator->ConvertToOutputFormat(
      srcFilename, cmOutputConverter::SHELL);
  };
  auto escapedModuleObjectFilename =
    this->ConvertToNinjaPath(moduleObjectFilename);

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = "Swift";
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Build up the list of source files in the module
  std::vector<std::string> filenames;
  filenames.reserve(moduleSourceFiles.size());
  for (cmSourceFile const* sf : moduleSourceFiles) {
    filenames.emplace_back(
      escapeSourceFileName(this->GetCompiledSourceNinjaPath(sf)));
  }
  // Note that `escapedSourceFilenames` must remain alive until the
  // compileObjectVars is consumed or Source will be a dangling pointer.
  std::string const escapedSourceFilenames = cmJoin(filenames, " ");
  compileObjectVars.Source = escapedSourceFilenames.c_str();

  std::string const& compileCommand =
    this->Makefile->GetRequiredDefinition("CMAKE_Swift_COMPILE_OBJECT");
  cmList compileCmds(compileCommand);

  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();

  for (cmSourceFile const* sf : moduleSourceFiles) {
    std::string const sourceFilename = this->GetCompiledSourceNinjaPath(sf);
    std::string objectFilename = escapedModuleObjectFilename;

    if (!singleOutput) {
      // If it's not single-output, each source file gets a separate object
      objectFilename =
        this->ConvertToNinjaPath(this->GetObjectFilePath(sf, outputConfig));
    }
    compileObjectVars.Objects = objectFilename.c_str();

    for (std::string& cmd : compileCmds) {
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   cmd, compileObjectVars);
    }

    std::string commandLine = this->GetLocalGenerator()->BuildCommandLine(
      compileCmds, outputConfig, outputConfig);

    this->GetGlobalGenerator()->AddCXXCompileCommand(
      commandLine, sourceFilename, objectFilename);
  }
}